

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O1

ZyanStatus ZyanVectorShiftRight(ZyanVector *vector,ZyanUSize index,ZyanUSize count)

{
  ZyanUSize ZVar1;
  void *pvVar2;
  
  ZVar1 = vector->element_size;
  if (ZVar1 == 0) {
    __assert_fail("vector->element_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x9e,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
  }
  pvVar2 = vector->data;
  if (pvVar2 != (void *)0x0) {
    if (vector->size + count <= vector->capacity) {
      pvVar2 = memmove((void *)((count + index) * ZVar1 + (long)pvVar2),
                       (void *)(ZVar1 * index + (long)pvVar2),(vector->size - index) * ZVar1);
      return (ZyanStatus)pvVar2;
    }
    __assert_fail("vector->size + count <= vector->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0xa1,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
  }
  __assert_fail("vector->data",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                ,0x9f,"ZyanStatus ZyanVectorShiftRight(ZyanVector *, ZyanUSize, ZyanUSize)");
}

Assistant:

static ZyanStatus ZyanVectorShiftRight(ZyanVector* vector, ZyanUSize index, ZyanUSize count)
{
    ZYAN_ASSERT(vector);
    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);
    ZYAN_ASSERT(count > 0);
    ZYAN_ASSERT(vector->size + count <= vector->capacity);

    const void* const source = ZYCORE_VECTOR_OFFSET(vector, index);
    void* const dest         = ZYCORE_VECTOR_OFFSET(vector, index + count);
    const ZyanUSize size     = (vector->size - index) * vector->element_size;
    ZYAN_MEMMOVE(dest, source, size);

    return ZYAN_STATUS_SUCCESS;
}